

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_transaction_base.cpp
# Opt level: O2

SignDataType cfd::js::api::ConvertToSignDataType(string *data_type)

{
  bool bVar1;
  SignDataType SVar2;
  CfdException *this;
  allocator local_39;
  undefined1 local_38 [32];
  
  bVar1 = std::operator==(data_type,"sign");
  SVar2 = kSign;
  if (!bVar1) {
    bVar1 = std::operator==(data_type,"binary");
    if (bVar1) {
      SVar2 = kBinary;
    }
    else {
      bVar1 = std::operator==(data_type,"pubkey");
      if (bVar1) {
        SVar2 = kPubkey;
      }
      else {
        bVar1 = std::operator==(data_type,"redeem_script");
        if (bVar1) {
          SVar2 = kRedeemScript;
        }
        else {
          bVar1 = std::operator==(data_type,"op_code");
          if (!bVar1) {
            local_38._0_8_ = "cfdjs_transaction_base.cpp";
            local_38._8_4_ = 0x3e;
            local_38._16_8_ = "ConvertToSignDataType";
            core::logger::warn<std::__cxx11::string_const&>
                      ((CfdSourceLocation *)local_38,
                       "Failed to ConvertToSignDataType. Invalid data_type string passed. data_type=[{}]"
                       ,data_type);
            this = (CfdException *)__cxa_allocate_exception(0x30);
            std::__cxx11::string::string
                      ((string *)local_38,
                       "Sign data type convert error. Invalid data_type string passed.",&local_39);
            core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_38);
            __cxa_throw(this,&core::CfdException::typeinfo,core::CfdException::~CfdException);
          }
          SVar2 = kOpCode;
        }
      }
    }
  }
  return SVar2;
}

Assistant:

static SignDataType ConvertToSignDataType(const std::string& data_type) {
  if (data_type == "sign") {
    return SignDataType::kSign;
  } else if (data_type == "binary") {
    return SignDataType::kBinary;
  } else if (data_type == "pubkey") {
    return SignDataType::kPubkey;
  } else if (data_type == "redeem_script") {
    return SignDataType::kRedeemScript;
  } else if (data_type == "op_code") {
    return SignDataType::kOpCode;
  } else {
    warn(
        CFD_LOG_SOURCE,
        "Failed to ConvertToSignDataType. Invalid data_type string passed. "
        "data_type=[{}]",
        data_type);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Sign data type convert error. Invalid data_type string passed.");
  }
}